

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall vkt::shaderexecutor::Functions::Sin::Sin(Sin *this)

{
  allocator<char> local_61;
  string local_60;
  Interval local_40;
  Interval local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"sin",&local_61);
  local_28.m_hasNaN = false;
  local_28.m_lo = -1.0;
  local_28.m_hi = -1.0;
  local_40.m_hasNaN = false;
  local_40.m_lo = 1.0;
  local_40.m_hi = 1.0;
  TrigFunc::TrigFunc(&this->super_TrigFunc,&local_60,deSin,&local_28,&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  (this->super_TrigFunc).super_CFloatFunc1.super_FloatFunc1.
  super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .
  super_Func<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__CFloatFunc1_00bedf20;
  return;
}

Assistant:

Sin			(void) : TrigFunc("sin", deSin, -1.0, 1.0) {}